

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_cached_string.c
# Opt level: O2

uintptr_t ht_feature_cached_string_push(HT_Timeline *timeline,char *label)

{
  void **ppvVar1;
  HT_Bag *bag;
  uint uVar2;
  HT_EventKlass *pHVar3;
  HT_TimestampNs HVar4;
  char *pcVar5;
  size_t sVar6;
  void *data;
  HT_Event local_50;
  void *local_38;
  char *local_30;
  
  bag = (HT_Bag *)timeline->features[1];
  if (bag == (HT_Bag *)0x0) {
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/luisbg[P]hawktracer/lib/feature_cached_string.c"
                  ,0x1b,"uintptr_t ht_feature_cached_string_push(HT_Timeline *, const char *)");
  }
  uVar2 = 0x1505;
  for (pcVar5 = label; *pcVar5 != '\0'; pcVar5 = pcVar5 + 1) {
    uVar2 = uVar2 * 0x21 + (int)*pcVar5;
  }
  data = (void *)(ulong)uVar2;
  sVar6 = 0;
  do {
    if (bag->size == sVar6) {
      ht_bag_add(bag,data);
      pHVar3 = ht_HT_StringMappingEvent_get_event_klass_instance();
      HVar4 = ht_monotonic_clock_get_timestamp();
      local_50.id = ht_event_id_provider_next(timeline->id_provider);
      local_50.klass = pHVar3;
      local_50.timestamp = HVar4;
      local_38 = data;
      local_30 = label;
      ht_timeline_push_event(timeline,&local_50);
      return (uintptr_t)data;
    }
    ppvVar1 = bag->data + sVar6;
    sVar6 = sVar6 + 1;
  } while (data != *ppvVar1);
  return (uintptr_t)data;
}

Assistant:

uintptr_t
ht_feature_cached_string_push(HT_Timeline* timeline, const char* label)
{
    HT_FeatureCachedString* f = (HT_FeatureCachedString*)timeline->features[HT_FEATURE_CACHED_STRING];
    assert(f);
    size_t i;
    uintptr_t id = djb2_hash(label);

    for (i = 0; i < f->cached_data.size; i++)
    {
        if ((uintptr_t)f->cached_data.data[i] == id)
        {
            return id;
        }
    }

    ht_bag_add(&f->cached_data, (void*)id);
    HT_TIMELINE_PUSH_EVENT(timeline, HT_StringMappingEvent, id, label);

    return id;
}